

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  long lVar1;
  int iVar2;
  FieldDescriptorProto *proto_00;
  DescriptorProto *proto_01;
  EnumDescriptorProto *proto_02;
  int local_2c;
  int local_28;
  int i_2;
  int i_1;
  int i;
  FileDescriptorProto *proto_local;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  i_2 = 0;
  while( true ) {
    iVar2 = FileDescriptor::extension_count(file);
    if (iVar2 <= i_2) break;
    lVar1 = *(long *)(file + 0x98);
    proto_00 = FileDescriptorProto::extension(proto,i_2);
    ValidateProto3Field(this,(FieldDescriptor *)(lVar1 + (long)i_2 * 0xa8),proto_00);
    i_2 = i_2 + 1;
  }
  local_28 = 0;
  while( true ) {
    iVar2 = FileDescriptor::message_type_count(file);
    if (iVar2 <= local_28) break;
    lVar1 = *(long *)(file + 0x60);
    proto_01 = FileDescriptorProto::message_type(proto,local_28);
    ValidateProto3Message(this,(Descriptor *)(lVar1 + (long)local_28 * 0xa8),proto_01);
    local_28 = local_28 + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar2 = FileDescriptor::enum_type_count(file);
    if (iVar2 <= local_2c) break;
    lVar1 = *(long *)(file + 0x70);
    proto_02 = FileDescriptorProto::enum_type(proto,local_2c);
    ValidateProto3Enum(this,(EnumDescriptor *)(lVar1 + (long)local_2c * 0x38),proto_02);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3(
    FileDescriptor* file, const FileDescriptorProto& proto) {
  for (int i = 0; i < file->extension_count(); ++i) {
    ValidateProto3Field(file->extensions_ + i, proto.extension(i));
  }
  for (int i = 0; i < file->message_type_count(); ++i) {
    ValidateProto3Message(file->message_types_ + i, proto.message_type(i));
  }
  for (int i = 0; i < file->enum_type_count(); ++i) {
    ValidateProto3Enum(file->enum_types_ + i, proto.enum_type(i));
  }
}